

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

void process_example(vw *all,bfgs *b,example *ec)

{
  undefined4 *puVar1;
  size_t sVar2;
  float *pfVar3;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  float fVar4;
  float fVar5;
  float sd;
  float d_dot_x;
  label_data *ld;
  example *in_stack_ffffffffffffffb8;
  vw *in_stack_ffffffffffffffc0;
  example *in_stack_ffffffffffffffc8;
  undefined8 uVar6;
  vw *in_stack_ffffffffffffffd0;
  ulong uVar7;
  
  puVar1 = (undefined4 *)(in_RDX + 0x6828);
  if ((*(byte *)(in_RSI + 0x110) & 1) != 0) {
    *(double *)(in_RSI + 0x100) = (double)*(float *)(in_RDX + 0x6870) + *(double *)(in_RSI + 0x100);
  }
  if ((*(byte *)(in_RSI + 0x111) & 1) == 0) {
    fVar4 = dot_with_direction(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    uVar7 = *(ulong *)(in_RSI + 0x90);
    sVar2 = v_array<float>::size((v_array<float> *)(in_RSI + 0x70));
    if (sVar2 <= uVar7) {
      sVar2 = v_array<float>::size((v_array<float> *)(in_RSI + 0x70));
      *(size_t *)(in_RSI + 0x90) = sVar2 - 1;
    }
    pfVar3 = v_array<float>::operator[]
                       ((v_array<float> *)(in_RSI + 0x70),*(size_t *)(in_RSI + 0x90));
    *(float *)(in_RDX + 0x6850) = *pfVar3;
    pfVar3 = v_array<float>::operator[]
                       ((v_array<float> *)(in_RSI + 0x70),*(size_t *)(in_RSI + 0x90));
    *(float *)(in_RDX + 0x68a8) = *pfVar3;
    fVar5 = (float)(**(code **)(*(long *)in_RDI[0x6a9] + 8))
                             (*(undefined4 *)(in_RDX + 0x6850),*puVar1,(long *)in_RDI[0x6a9],*in_RDI
                             );
    *(float *)(in_RDX + 0x68b0) = fVar5 * *(float *)(in_RDX + 0x6870);
    in_stack_ffffffffffffffc0 = (vw *)in_RDI[0x6a9];
    uVar6 = *in_RDI;
    sVar2 = *(size_t *)(in_RSI + 0x90);
    *(size_t *)(in_RSI + 0x90) = sVar2 + 1;
    pfVar3 = v_array<float>::operator[]((v_array<float> *)(in_RSI + 0x70),sVar2);
    fVar5 = (float)(*(code *)in_stack_ffffffffffffffc0->sd->weighted_labels)
                             (*pfVar3,*puVar1,in_stack_ffffffffffffffc0,uVar6);
    *(double *)(in_RSI + 0x108) =
         (double)fVar4 * (double)fVar4 * (double)fVar5 * (double)*(float *)(in_RDX + 0x6870) +
         *(double *)(in_RSI + 0x108);
  }
  else {
    fVar4 = predict_and_gradient(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    *(float *)(in_RDX + 0x6850) = fVar4;
    fVar4 = (float)(**(code **)(*(long *)in_RDI[0x6a9] + 8))
                             (*(undefined4 *)(in_RDX + 0x6850),*puVar1,(long *)in_RDI[0x6a9],*in_RDI
                             );
    *(float *)(in_RDX + 0x68b0) = fVar4 * *(float *)(in_RDX + 0x6870);
    *(double *)(in_RSI + 0xe8) = (double)*(float *)(in_RDX + 0x68b0) + *(double *)(in_RSI + 0xe8);
    v_array<float>::push_back
              ((v_array<float> *)in_stack_ffffffffffffffc0,(float *)in_stack_ffffffffffffffb8);
  }
  *(undefined4 *)(in_RDX + 0x68ac) = *(undefined4 *)(in_RDX + 0x6850);
  if ((*(byte *)(in_RSI + 0x112) & 1) != 0) {
    update_preconditioner(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void process_example(vw& all, bfgs& b, example& ec)
{
  label_data& ld = ec.l.simple;
  if (b.first_pass)
    b.importance_weight_sum += ec.weight;

  /********************************************************************/
  /* I) GRADIENT CALCULATION ******************************************/
  /********************************************************************/
  if (b.gradient_pass)
  {
    ec.pred.scalar = predict_and_gradient(all, ec);  // w[0] & w[1]
    ec.loss = all.loss->getLoss(all.sd, ec.pred.scalar, ld.label) * ec.weight;
    b.loss_sum += ec.loss;
    b.predictions.push_back(ec.pred.scalar);
  }
  /********************************************************************/
  /* II) CURVATURE CALCULATION ****************************************/
  /********************************************************************/
  else  // computing curvature
  {
    float d_dot_x = dot_with_direction(all, ec);   // w[2]
    if (b.example_number >= b.predictions.size())  // Make things safe in case example source is strange.
      b.example_number = b.predictions.size() - 1;
    ec.pred.scalar = b.predictions[b.example_number];
    ec.partial_prediction = b.predictions[b.example_number];
    ec.loss = all.loss->getLoss(all.sd, ec.pred.scalar, ld.label) * ec.weight;
    float sd = all.loss->second_derivative(all.sd, b.predictions[b.example_number++], ld.label);
    b.curvature += ((double)d_dot_x) * d_dot_x * sd * ec.weight;
  }
  ec.updated_prediction = ec.pred.scalar;

  if (b.preconditioner_pass)
    update_preconditioner(all, ec);  // w[3]
}